

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strpbrk(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  sxi32 sVar1;
  char *zStr;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  sxu32 nMax;
  int iListLen;
  int iLen;
  sxu32 local_48;
  sxu32 local_44;
  int local_40;
  sxu32 local_3c;
  jx9_context *local_38;
  
  if (1 < nArg) {
    zStr = jx9_value_to_string(*apArg,(int *)&local_3c);
    pcVar2 = jx9_value_to_string(apArg[1],&local_40);
    if (0 < (int)local_3c) {
      local_48 = 0xffffffff;
      if (0 < (long)local_40) {
        local_44 = local_3c;
        uVar3 = 0xffffffff;
        uVar5 = 0;
        local_38 = pCtx;
        do {
          sVar1 = SyByteFind(zStr,local_3c,(int)pcVar2[uVar5],&local_48);
          uVar4 = local_48;
          if (uVar3 <= local_48) {
            uVar4 = uVar3;
          }
          if (sVar1 != 0) {
            uVar4 = uVar3;
          }
          uVar3 = uVar4;
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)(long)local_40);
        pCtx = local_38;
        if (uVar3 != 0xffffffff) {
          jx9_value_string(local_38->pRet,zStr + uVar3,local_44 - uVar3);
          return 0;
        }
      }
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_strpbrk(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zList, *zEnd;
	int iLen, iListLen, i, c;
	sxu32 nOfft, nMax;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the haystack and the char list */
	zString = jx9_value_to_string(apArg[0], &iLen);
	zList = jx9_value_to_string(apArg[1], &iListLen);
	if( iLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	nOfft = nMax = SXU32_HIGH;
	/* perform the requested operation */
	for( i = 0 ; i < iListLen ; i++ ){
		c = zList[i];
		rc = SyByteFind(zString, (sxu32)iLen, c, &nMax);
		if( rc == SXRET_OK ){
			if( nMax < nOfft ){
				nOfft = nMax;
			}
		}
	}
	if( nOfft == SXU32_HIGH ){
		/* No such substring, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the substring */
		jx9_result_string(pCtx, &zString[nOfft], (int)(zEnd-&zString[nOfft]));
	}
	return JX9_OK;
}